

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy
          (TemplateDictionary *this,TemplateString variable,TemplateString value)

{
  TemplateDictionary *pTVar1;
  BaseArena *this_00;
  UnsafeArena *pUVar2;
  TemplateString key;
  TemplateString value_00;
  TemplateDictionary *this_01;
  VariableDict *pVVar3;
  TemplateString local_78;
  char *local_58;
  size_t sStack_50;
  bool local_48;
  undefined7 uStack_47;
  TemplateId TStack_40;
  
  pTVar1 = this->template_global_dict_owner_;
  if (pTVar1 != (TemplateDictionary *)0x0) {
    if (pTVar1->template_global_dict_ == (TemplateDictionary *)0x0) {
      local_78.ptr_ = "Template Globals";
      local_78.length_ = 0x10;
      local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
      local_78.id_ = 0;
      this_00 = &this->arena_->super_BaseArena;
      this_01 = (TemplateDictionary *)BaseArena::GetMemory(this_00,0x70,8);
      TemplateDictionary(this_01,&local_78,(UnsafeArena *)this_00,pTVar1,pTVar1);
      this->template_global_dict_owner_->template_global_dict_ = this_01;
    }
    pTVar1 = this->template_global_dict_owner_->template_global_dict_;
    local_48 = variable.is_immutable_;
    uStack_47 = variable._17_7_;
    TStack_40 = variable.id_;
    local_58 = variable.ptr_;
    sStack_50 = variable.length_;
    local_78.is_immutable_ = value.is_immutable_;
    local_78._17_7_ = value._17_7_;
    local_78.id_ = value.id_;
    local_78.ptr_ = value.ptr_;
    local_78.length_ = value.length_;
    if (pTVar1->variable_dict_ == (VariableDict *)0x0) {
      pVVar3 = (VariableDict *)BaseArena::GetMemory(&pTVar1->arena_->super_BaseArena,0xb0,8);
      pUVar2 = pTVar1->arena_;
      pVVar3->size_ = 0;
      (pVVar3->functor_).arena_ = pUVar2;
      pTVar1->variable_dict_ = pVVar3;
    }
    key.length_ = sStack_50;
    key.ptr_ = local_58;
    key.is_immutable_ = local_48;
    key._17_7_ = uStack_47;
    key.id_ = TStack_40;
    value_00.length_ = local_78.length_;
    value_00.ptr_ = local_78.ptr_;
    value_00.is_immutable_ = local_78.is_immutable_;
    value_00._17_7_ = local_78._17_7_;
    value_00.id_ = local_78.id_;
    HashInsert<ctemplate::small_map<std::map<unsigned_long,ctemplate::TemplateString,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,ctemplate::TemplateString>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,ctemplate::TemplateString>
              (pTVar1->variable_dict_,key,value_00);
    return;
  }
  __assert_fail("template_global_dict_owner_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                ,0x200,
                "void ctemplate::TemplateDictionary::SetTemplateGlobalValueWithoutCopy(const TemplateString, const TemplateString)"
               );
}

Assistant:

void TemplateDictionary::SetTemplateGlobalValueWithoutCopy(
    const TemplateString variable,
    const TemplateString value) {
  assert(template_global_dict_owner_ != NULL);
  LazyCreateTemplateGlobalDict();
  // Don't memdup value - the caller will manage memory.
  template_global_dict_owner_->template_global_dict_->
      SetValueWithoutCopy(variable, value);
}